

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>_>
::~Stack(Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>_>
         *this)

{
  long in_RDI;
  unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>
  *p;
  unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>
  *this_00;
  
  this_00 = *(unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>
              **)(in_RDI + 0x10);
  while (this_00 !=
         *(unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>
           **)(in_RDI + 8)) {
    this_00 = this_00 + -1;
    std::
    unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::SplittingCongruenceClosure>_>_>
    ::~unique_ptr(this_00);
  }
  if (*(long *)(in_RDI + 8) != 0) {
    free(*(void **)(in_RDI + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }